

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * kj::_::fill<kj::ArrayPtr<int>,kj::StringPtr&,kj::_::Delimited<kj::ArrayPtr<int_const>>>
                 (char *target,Delimited<kj::ArrayPtr<int>_> *first,StringPtr *rest,
                 Delimited<kj::ArrayPtr<const_int>_> *rest_1)

{
  char *pcVar1;
  
  pcVar1 = Delimited<kj::ArrayPtr<int>_>::flattenTo(first,target);
  pcVar1 = fill<kj::StringPtr,kj::_::Delimited<kj::ArrayPtr<int_const>>>(pcVar1,rest,rest_1);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, Delimited<T>&& first, Rest&&... rest) {
  target = first.flattenTo(target);
  return fill(target, kj::fwd<Rest>(rest)...);
}